

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svrg.cc
# Opt level: O1

void SVRG::learn(svrg *s,single_learner *base,example *ec)

{
  weight wVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  ulong uVar5;
  weight *pwVar6;
  uint32_t *puVar7;
  vw *pvVar8;
  ulong uVar9;
  
  predict(s,base,ec);
  pvVar8 = s->all;
  iVar3 = (int)pvVar8->passes_complete;
  if (iVar3 % (s->stage_size + 1) == 0) {
    if ((s->prev_pass != iVar3) && (pvVar8->quiet == false)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"svrg pass ",10);
      poVar4 = (ostream *)std::ostream::operator<<(&std::cout,iVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,": committing stable point",0x19);
      std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      pvVar8 = s->all;
      if (pvVar8->num_bits < 0x20) {
        uVar9 = 0;
        do {
          bVar2 = (pvVar8->weights).sparse;
          if (bVar2 == false) {
            puVar7 = &(pvVar8->weights).dense_weights._stride_shift;
          }
          else {
            puVar7 = &(pvVar8->weights).sparse_weights._stride_shift;
          }
          uVar5 = uVar9 << ((byte)*puVar7 & 0x3f);
          if (bVar2 == true) {
            pwVar6 = sparse_parameters::operator[](&(pvVar8->weights).sparse_weights,uVar5);
          }
          else {
            pwVar6 = (pvVar8->weights).dense_weights._begin +
                     (uVar5 & (pvVar8->weights).dense_weights._weight_mask);
          }
          wVar1 = *pwVar6;
          pvVar8 = s->all;
          bVar2 = (pvVar8->weights).sparse;
          if (bVar2 == false) {
            puVar7 = &(pvVar8->weights).dense_weights._stride_shift;
          }
          else {
            puVar7 = &(pvVar8->weights).sparse_weights._stride_shift;
          }
          uVar5 = uVar9 << ((byte)*puVar7 & 0x3f);
          if (bVar2 == true) {
            pwVar6 = sparse_parameters::operator[](&(pvVar8->weights).sparse_weights,uVar5);
          }
          else {
            pwVar6 = (pvVar8->weights).dense_weights._begin +
                     (uVar5 & (pvVar8->weights).dense_weights._weight_mask);
          }
          pwVar6[1] = wVar1;
          pvVar8 = s->all;
          bVar2 = (pvVar8->weights).sparse;
          if (bVar2 == false) {
            puVar7 = &(pvVar8->weights).dense_weights._stride_shift;
          }
          else {
            puVar7 = &(pvVar8->weights).sparse_weights._stride_shift;
          }
          uVar5 = uVar9 << ((byte)*puVar7 & 0x3f);
          if (bVar2 == true) {
            pwVar6 = sparse_parameters::operator[](&(pvVar8->weights).sparse_weights,uVar5);
          }
          else {
            pwVar6 = (pvVar8->weights).dense_weights._begin +
                     (uVar5 & (pvVar8->weights).dense_weights._weight_mask);
          }
          pwVar6[2] = 0.0;
          pvVar8 = s->all;
          uVar9 = uVar9 + 1;
        } while (uVar9 < (1L << ((byte)pvVar8->num_bits & 0x3f) & 0xffffffffU));
      }
      s->stable_grad_count = 0;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"svrg pass ",10);
      poVar4 = (ostream *)std::ostream::operator<<(&std::cout,iVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,": computing exact gradient",0x1a);
      std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
    }
    update_stable(s,ec);
    s->stable_grad_count = s->stable_grad_count + 1;
  }
  else {
    if ((s->prev_pass != iVar3) && (pvVar8->quiet == false)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"svrg pass ",10);
      poVar4 = (ostream *)std::ostream::operator<<(&std::cout,iVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,": taking steps",0xe);
      std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
    }
    update_inner(s,ec);
  }
  s->prev_pass = iVar3;
  return;
}

Assistant:

void learn(svrg& s, single_learner& base, example& ec)
{
  assert(ec.in_use);

  predict(s, base, ec);

  const int pass = (int)s.all->passes_complete;

  if (pass % (s.stage_size + 1) == 0)  // Compute exact gradient
  {
    if (s.prev_pass != pass && !s.all->quiet)
    {
      cout << "svrg pass " << pass << ": committing stable point" << endl;
      for (uint32_t j = 0; j < VW::num_weights(*s.all); j++)
      {
        float w = VW::get_weight(*s.all, j, W_INNER);
        VW::set_weight(*s.all, j, W_STABLE, w);
        VW::set_weight(*s.all, j, W_STABLEGRAD, 0.f);
      }
      s.stable_grad_count = 0;
      cout << "svrg pass " << pass << ": computing exact gradient" << endl;
    }
    update_stable(s, ec);
    s.stable_grad_count++;
  }
  else  // Perform updates
  {
    if (s.prev_pass != pass && !s.all->quiet)
    {
      cout << "svrg pass " << pass << ": taking steps" << endl;
    }
    update_inner(s, ec);
  }

  s.prev_pass = pass;
}